

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tvrq_api.c
# Opt level: O0

int RqInterExecute(RqInterProgram *pcInterProgMem,size_t nSymSize,void *pcInSymMem,
                  size_t nInSymMemSize,void *pInterSymMem,size_t nInterSymMemSize)

{
  undefined8 in_RCX;
  m256v *in_RDX;
  long in_RSI;
  int *in_RDI;
  int *in_R8;
  int *in_R9;
  int l;
  int i;
  m256v Y;
  m256v IB;
  int in_stack_ffffffffffffff8c;
  int iVar1;
  int in_stack_ffffffffffffff9c;
  m256v *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  m256v *in_stack_ffffffffffffffb0;
  m256v *in_stack_ffffffffffffffc0;
  int local_4;
  
  if (in_R9 < (int *)(in_RDI[1] * in_RSI)) {
    fprintf(_stderr,"Error:%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/api/tvrq_api.c",
            0xc5,"Not enough space for Intermediate block provided.");
    local_4 = -1;
  }
  else {
    m256v_make((m256v *)&stack0xffffffffffffffb0,in_RDI[1],(int)in_RSI,(uint8_t *)in_R8);
    m256v_make((m256v *)&stack0xffffffffffffff98,in_RDI[8],(int)in_RSI,(uint8_t *)in_RDX);
    for (iVar1 = 0; iVar1 < *in_RDI; iVar1 = iVar1 + 1) {
      if (in_RDI[(long)iVar1 + 9] < in_RDI[8]) {
        m256v_copy_row(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0
                       ,in_stack_ffffffffffffff9c);
      }
      else {
        m256v_clear_row((m256v *)CONCAT44(iVar1,in_RDI[(long)iVar1 + 9]),in_stack_ffffffffffffff8c);
      }
    }
    m256v_LU_invmult_inplace
              (in_RDX,(int)((ulong)in_RCX >> 0x20),in_R8,in_R9,in_stack_ffffffffffffffc0);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int RqInterExecute(const RqInterProgram* pcInterProgMem,
		   size_t nSymSize,
		   const void* pcInSymMem,
		   size_t nInSymMemSize,
		   void* pInterSymMem,
		   size_t nInterSymMemSize)
{
	/* Check memory sizes */
#if 0
	if (symbolDataSize < pcInterProgMem->nESI * nSymSize) {
		errmsg("Too little symbol data provided.");
		return RQ_ERR_ENOMEM;
	}
#endif
	if (nInterSymMemSize < pcInterProgMem->LU.n_col * nSymSize) {
		errmsg("Not enough space for Intermediate block provided.");
		return RQ_ERR_ENOMEM;
	}

	/* Create matrices */
	m256v IB = m256v_make(pcInterProgMem->LU.n_col, nSymSize, pInterSymMem);
	m256v Y = m256v_make(pcInterProgMem->nESI, nSymSize, (void*)pcInSymMem);

	/* Move data into the IB matrix */
	for (int i = 0; i < pcInterProgMem->LU.n_row; ++i) {
		const int l = pcInterProgMem->rowperm[i];
		if (l >= pcInterProgMem->nESI) {
			/* This row contains either a padded LT symbol
			 * or an LDPC symbol or an HDPC symbol.  In
			 * any case the corresponding RHS term is zero
			 */
			m256v_clear_row(&IB, i);
		} else {
			/* Row comes from an LT symbol */
			m256v_copy_row(&Y, l, &IB, i);
		}
	}

	/* Solve */
	m256v_LU_invmult_inplace(&pcInterProgMem->LU, -1, NULL, NULL, &IB);
	return 0;
}